

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int *__n;
  int *piVar4;
  ssize_t sVar5;
  long lVar6;
  undefined1 *__buf;
  int fds_stdout [2];
  int fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  uv_write_t write_req;
  uchar ubuf [1023];
  undefined1 auStack_e00 [1032];
  undefined8 uStack_9f8;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined1 local_9c8 [16];
  uv_stdio_container_t local_9b8;
  undefined4 local_9a8;
  undefined1 *local_9a0;
  undefined1 local_990 [264];
  undefined1 local_888 [264];
  undefined1 local_780 [264];
  undefined1 local_678 [264];
  undefined1 local_570 [136];
  undefined1 local_4e8 [192];
  undefined1 local_428 [1032];
  
  init_process_options("spawn_helper9",exit_cb);
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,local_678,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_init(uVar3,local_780,0);
    if (iVar1 != 0) goto LAB_0017c366;
    iVar1 = uv_pipe_init(uVar3,local_888,0);
    if (iVar1 != 0) goto LAB_0017c36b;
    iVar1 = uv_pipe_init(uVar3,local_990,0);
    if (iVar1 != 0) goto LAB_0017c370;
    iVar1 = uv_pipe(&local_9d0,0,0);
    if (iVar1 != 0) goto LAB_0017c375;
    iVar1 = uv_pipe(&local_9d8,0,0);
    if (iVar1 != 0) goto LAB_0017c37a;
    iVar1 = uv_pipe_open(local_678,local_9d0);
    if (iVar1 != 0) goto LAB_0017c37f;
    iVar1 = uv_pipe_open(local_780,local_9d4);
    if (iVar1 != 0) goto LAB_0017c384;
    iVar1 = uv_pipe_open(local_888,local_9cc);
    if (iVar1 != 0) goto LAB_0017c389;
    iVar1 = uv_pipe_open(local_990,local_9d8);
    if (iVar1 != 0) goto LAB_0017c38e;
    iVar1 = uv_is_readable();
    if (iVar1 == 0) goto LAB_0017c393;
    iVar1 = uv_is_writable();
    if (iVar1 == 0) goto LAB_0017c398;
    iVar1 = uv_is_writable();
    if (iVar1 == 0) goto LAB_0017c39d;
    iVar1 = uv_is_readable();
    if (iVar1 == 0) goto LAB_0017c3a2;
    iVar1 = uv_is_writable((uv_stream_t *)local_678);
    iVar2 = uv_is_readable();
    if (iVar2 != iVar1) goto LAB_0017c3a7;
    iVar2 = uv_is_readable();
    if (iVar2 != iVar1) goto LAB_0017c3ac;
    iVar2 = uv_is_writable();
    if (iVar2 != iVar1) goto LAB_0017c3b1;
    options.stdio = &local_9b8;
    local_9b8.flags = UV_INHERIT_STREAM;
    local_9a8 = 4;
    options.stdio_count = 2;
    local_9b8.data.stream = (uv_stream_t *)local_678;
    local_9a0 = local_780;
    iVar1 = uv_spawn(uVar3,local_570,&options);
    if (iVar1 != 0) goto LAB_0017c3b6;
    lVar6 = 0;
    uv_close(local_678,0);
    uv_close(local_780,0);
    local_9c8 = uv_buf_init(local_428);
    do {
      local_428[lVar6] = (char)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x3ff);
    memset(output,0,0x3ff);
    iVar1 = uv_write(local_4e8,local_888,local_9c8,1,write_cb);
    if (iVar1 != 0) goto LAB_0017c3bb;
    iVar1 = uv_read_start(local_990,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_0017c3c0;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0017c3c5;
    if (exit_cb_called != 1) goto LAB_0017c3ca;
    if (close_cb_called != 3) goto LAB_0017c3cf;
    iVar1 = bcmp(local_428,output,0x3ff);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017c3d9;
    }
  }
  else {
    run_test_spawn_inherit_streams_cold_1();
LAB_0017c366:
    run_test_spawn_inherit_streams_cold_2();
LAB_0017c36b:
    run_test_spawn_inherit_streams_cold_3();
LAB_0017c370:
    run_test_spawn_inherit_streams_cold_4();
LAB_0017c375:
    run_test_spawn_inherit_streams_cold_5();
LAB_0017c37a:
    run_test_spawn_inherit_streams_cold_6();
LAB_0017c37f:
    run_test_spawn_inherit_streams_cold_7();
LAB_0017c384:
    run_test_spawn_inherit_streams_cold_8();
LAB_0017c389:
    run_test_spawn_inherit_streams_cold_9();
LAB_0017c38e:
    run_test_spawn_inherit_streams_cold_10();
LAB_0017c393:
    run_test_spawn_inherit_streams_cold_25();
LAB_0017c398:
    run_test_spawn_inherit_streams_cold_24();
LAB_0017c39d:
    run_test_spawn_inherit_streams_cold_23();
LAB_0017c3a2:
    run_test_spawn_inherit_streams_cold_22();
LAB_0017c3a7:
    run_test_spawn_inherit_streams_cold_11();
LAB_0017c3ac:
    run_test_spawn_inherit_streams_cold_12();
LAB_0017c3b1:
    run_test_spawn_inherit_streams_cold_13();
LAB_0017c3b6:
    run_test_spawn_inherit_streams_cold_14();
LAB_0017c3bb:
    run_test_spawn_inherit_streams_cold_15();
LAB_0017c3c0:
    run_test_spawn_inherit_streams_cold_16();
LAB_0017c3c5:
    run_test_spawn_inherit_streams_cold_17();
LAB_0017c3ca:
    run_test_spawn_inherit_streams_cold_18();
LAB_0017c3cf:
    run_test_spawn_inherit_streams_cold_19();
  }
  run_test_spawn_inherit_streams_cold_20();
LAB_0017c3d9:
  run_test_spawn_inherit_streams_cold_21();
  uStack_9f8 = uVar3;
LAB_0017c3ef:
  uVar3 = 0;
  __n = (int *)read(0,auStack_e00,0x400);
  piVar4 = __n;
  if (__n == (int *)0xffffffffffffffff) goto code_r0x0017c407;
  goto LAB_0017c411;
code_r0x0017c407:
  piVar4 = __errno_location();
  if (*piVar4 != 4) {
LAB_0017c411:
    if (__n == (int *)0x0) {
      return (int)piVar4;
    }
    __buf = auStack_e00;
    if ((long)__n < 1) {
LAB_0017c464:
      spawn_stdin_stdout_cold_1();
      iVar1 = uv_is_closing();
      if (iVar1 == 0) {
        iVar1 = uv_close(uVar3,0);
        return iVar1;
      }
      return iVar1;
    }
LAB_0017c41e:
    do {
      uVar3 = 1;
      sVar5 = write(1,__buf,(size_t)__n);
      if (sVar5 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 == 4) goto LAB_0017c41e;
      }
      if (sVar5 < 0) {
        spawn_stdin_stdout_cold_2();
        goto LAB_0017c464;
      }
      __n = (int *)((long)__n - sVar5);
      __buf = __buf + sVar5;
    } while (__n != (int *)0x0);
  }
  goto LAB_0017c3ef;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(uv_pipe(fds_stdin, 0, 0) == 0);
  ASSERT(uv_pipe(fds_stdout, 0, 0) == 0);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}